

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O3

void FAudioFXReverb_Process
               (FAudioFXReverb *fapo,uint32_t InputProcessParameterCount,
               FAPOProcessBufferParameters *pInputProcessParameters,
               uint32_t OutputProcessParameterCount,
               FAPOProcessBufferParameters *pOutputProcessParameters,int32_t IsEnabled)

{
  DspReverb *reverb;
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  FAPOBufferFlags FVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar15;
  undefined1 uVar17;
  undefined1 uVar19;
  undefined1 uVar21;
  float *pfVar9;
  void *pvVar10;
  void *pvVar11;
  uint8_t uVar22;
  uint uVar23;
  FAudioFXReverbParameters *params;
  ulong uVar24;
  float *pfVar25;
  undefined8 *puVar26;
  undefined8 *puVar27;
  DspReverbChannel *pDVar28;
  float *pfVar29;
  float *pfVar30;
  long lVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float *in_end;
  float late [4];
  FAudioFXReverbParameters local_68;
  undefined5 uVar14;
  undefined4 uVar16;
  undefined3 uVar18;
  undefined2 uVar20;
  
  uVar22 = FAPOBase_ParametersChanged(&fapo->base);
  FVar4 = pInputProcessParameters->BufferFlags;
  if (IsEnabled == 0) {
    pOutputProcessParameters->BufferFlags = FVar4;
    if (FVar4 != FAPO_BUFFER_SILENT) {
      puVar26 = (undefined8 *)pInputProcessParameters->pBuffer;
      puVar27 = (undefined8 *)pOutputProcessParameters->pBuffer;
      if (puVar26 != puVar27) {
        uVar24 = (ulong)pInputProcessParameters->ValidFrameCount;
        if (fapo->inBlockAlign == fapo->outBlockAlign) {
          SDL_memcpy(puVar27,puVar26,fapo->inBlockAlign * uVar24);
          return;
        }
        if (fapo->inChannels == 2) {
          if (fapo->outChannels != 6) goto LAB_0011795a;
          if (uVar24 != 0) {
            puVar1 = puVar26 + uVar24;
            do {
              uVar3 = *puVar26;
              puVar26 = puVar26 + 1;
              *puVar27 = uVar3;
              puVar27[1] = 0;
              puVar27[2] = 0;
              puVar27 = puVar27 + 3;
            } while (puVar26 < puVar1);
          }
        }
        else {
          if ((fapo->inChannels != 1) || (fapo->outChannels != 6)) {
LAB_0011795a:
            SDL_memset(puVar27,0,fapo->outBlockAlign * uVar24);
            return;
          }
          if (uVar24 != 0) {
            puVar1 = (undefined8 *)((long)puVar26 + uVar24 * 4);
            do {
              uVar2 = *(undefined4 *)puVar26;
              *(undefined4 *)puVar27 = uVar2;
              puVar26 = (undefined8 *)((long)puVar26 + 4);
              *(undefined4 *)((long)puVar27 + 4) = uVar2;
              puVar27[1] = 0;
              puVar27[2] = 0;
              puVar27 = puVar27 + 3;
            } while (puVar26 < puVar1);
          }
        }
      }
    }
    return;
  }
  if (FVar4 == FAPO_BUFFER_SILENT) {
    SDL_memset(pInputProcessParameters->pBuffer,0,
               (uint)fapo->inBlockAlign * pInputProcessParameters->ValidFrameCount);
  }
  params = (FAudioFXReverbParameters *)FAPOBase_BeginProcess(&fapo->base);
  if (uVar22 != '\0') {
    if (fapo->apiVersion == '\t') {
      local_68.WetDryMix = params->WetDryMix;
      local_68.ReflectionsDelay = params->ReflectionsDelay;
      local_68.ReverbDelay = params->ReverbDelay;
      local_68.RearDelay = params->RearDelay;
      uVar3._0_1_ = params->PositionRight;
      uVar3._1_1_ = params->PositionMatrixLeft;
      uVar12 = params->PositionMatrixRight;
      uVar13 = params->EarlyDiffusion;
      uVar15 = params->LateDiffusion;
      uVar17 = params->LowEQGain;
      uVar19 = params->LowEQCutoff;
      uVar21 = params->HighEQGain;
      uVar20 = CONCAT11(uVar21,uVar19);
      uVar18 = CONCAT21(uVar20,uVar17);
      uVar16 = CONCAT31(uVar18,uVar15);
      uVar14 = CONCAT41(uVar16,uVar13);
      uVar3._2_6_ = CONCAT51(uVar14,uVar12);
      local_68._10_2_ = SUB82(uVar3,0);
      local_68._12_4_ = SUB64(uVar3._2_6_,0);
      local_68.HighEQGain = params->HighEQCutoff;
      local_68.HighEQCutoff = *(uint8_t *)&params->RoomFilterFreq;
      local_68._20_8_ = *(undefined8 *)((long)&params->RoomFilterFreq + 1);
      local_68._28_8_ = *(undefined8 *)((long)&params->RoomFilterHF + 1);
      local_68._36_8_ = *(undefined8 *)((long)&params->ReverbGain + 1);
      local_68._44_8_ = *(undefined8 *)((long)&params->Density + 1);
      params = &local_68;
      local_68._16_2_ = uVar20;
    }
    DspReverb_SetParameters(&fapo->reverb,params);
  }
  reverb = &fapo->reverb;
  iVar5 = (fapo->reverb).out_channels;
  if (iVar5 == 2) {
    uVar23 = (uint)fapo->inChannels * pInputProcessParameters->ValidFrameCount;
    if (uVar23 != 0) {
      pvVar10 = pInputProcessParameters->pBuffer;
      pvVar11 = pOutputProcessParameters->pBuffer;
      fVar37 = 0.0;
      lVar31 = 0;
      do {
        pfVar30 = (float *)((long)pvVar10 + lVar31);
        fVar34 = (*pfVar30 + pfVar30[1]) * 0.5;
        fVar32 = (fapo->reverb).dry_ratio;
        pfVar25 = (fapo->reverb).early_delay.buffer;
        uVar6 = (fapo->reverb).early_delay.capacity;
        uVar7 = (fapo->reverb).early_delay.read_idx;
        fVar38 = pfVar25[uVar7];
        (fapo->reverb).early_delay.read_idx = (uVar7 + 1) % uVar6;
        uVar7 = (fapo->reverb).early_delay.write_idx;
        pfVar25[uVar7] = fVar34;
        (fapo->reverb).early_delay.write_idx = (uVar7 + 1) % uVar6;
        pfVar25 = (fapo->reverb).apf_in[0].delay.buffer;
        uVar6 = (fapo->reverb).apf_in[0].delay.capacity;
        uVar7 = (fapo->reverb).apf_in[0].delay.read_idx;
        uVar8 = (fapo->reverb).apf_in[0].delay.write_idx;
        fVar35 = pfVar25[uVar7];
        fVar38 = (fapo->reverb).apf_in[0].feedback_gain * fVar35 + fVar38;
        pfVar25[uVar8] = fVar38;
        fVar35 = fVar35 - fVar38 * (fapo->reverb).apf_in[0].feedback_gain;
        (fapo->reverb).apf_in[0].delay.read_idx = (uVar7 + 1) % uVar6;
        (fapo->reverb).apf_in[0].delay.write_idx = (uVar8 + 1) % uVar6;
        fVar38 = DspReverb_INTERNAL_ProcessChannel(reverb,(fapo->reverb).channel,fVar35);
        fVar35 = DspReverb_INTERNAL_ProcessChannel(reverb,(fapo->reverb).channel + 1,fVar35);
        fVar32 = fVar35 * (fapo->reverb).wet_ratio + fVar32 * fVar34;
        *(float *)((long)pvVar11 + lVar31) = fVar38;
        *(float *)((long)pvVar11 + lVar31 + 4) = fVar32;
        fVar37 = fVar37 + fVar38 * fVar38 + fVar32 * fVar32;
        lVar31 = lVar31 + 8;
      } while (pfVar30 + 2 < (float *)((long)pvVar10 + (ulong)uVar23 * 4));
      goto LAB_001178ee;
    }
  }
  else if (iVar5 == 1) {
    uVar23 = (uint)fapo->inChannels * pInputProcessParameters->ValidFrameCount;
    if (uVar23 != 0) {
      pfVar25 = (float *)pInputProcessParameters->pBuffer;
      pfVar29 = (float *)pOutputProcessParameters->pBuffer;
      pfVar30 = pfVar25 + uVar23;
      fVar37 = 0.0;
      do {
        pfVar9 = (fapo->reverb).early_delay.buffer;
        uVar23 = (fapo->reverb).early_delay.capacity;
        uVar6 = (fapo->reverb).early_delay.read_idx;
        fVar32 = *pfVar25;
        fVar38 = pfVar9[uVar6];
        (fapo->reverb).early_delay.read_idx = (uVar6 + 1) % uVar23;
        uVar6 = (fapo->reverb).early_delay.write_idx;
        pfVar9[uVar6] = fVar32;
        (fapo->reverb).early_delay.write_idx = (uVar6 + 1) % uVar23;
        pfVar9 = (fapo->reverb).apf_in[0].delay.buffer;
        uVar23 = (fapo->reverb).apf_in[0].delay.capacity;
        uVar6 = (fapo->reverb).apf_in[0].delay.read_idx;
        uVar7 = (fapo->reverb).apf_in[0].delay.write_idx;
        fVar35 = pfVar9[uVar6];
        fVar38 = (fapo->reverb).apf_in[0].feedback_gain * fVar35 + fVar38;
        pfVar9[uVar7] = fVar38;
        fVar34 = (fapo->reverb).apf_in[0].feedback_gain;
        pfVar25 = pfVar25 + 1;
        (fapo->reverb).apf_in[0].delay.read_idx = (uVar6 + 1) % uVar23;
        (fapo->reverb).apf_in[0].delay.write_idx = (uVar7 + 1) % uVar23;
        fVar38 = DspReverb_INTERNAL_ProcessChannel
                           (reverb,(fapo->reverb).channel,fVar35 - fVar38 * fVar34);
        fVar32 = fVar38 * (fapo->reverb).wet_ratio + fVar32 * (fapo->reverb).dry_ratio;
        *pfVar29 = fVar32;
        fVar37 = fVar37 + fVar32 * fVar32;
        pfVar29 = pfVar29 + 1;
      } while (pfVar25 < pfVar30);
      goto LAB_001178ee;
    }
  }
  else {
    iVar5 = (fapo->reverb).in_channels;
    pfVar30 = (float *)pInputProcessParameters->pBuffer;
    pfVar25 = (float *)pOutputProcessParameters->pBuffer;
    uVar23 = (uint)fapo->inChannels * pInputProcessParameters->ValidFrameCount;
    pfVar29 = pfVar30 + uVar23;
    if (iVar5 == 2) {
      if (uVar23 != 0) {
        fVar37 = 0.0;
        do {
          fVar36 = (*pfVar30 + pfVar30[1]) * 0.5;
          fVar32 = (fapo->reverb).dry_ratio;
          pfVar9 = (fapo->reverb).early_delay.buffer;
          uVar23 = (fapo->reverb).early_delay.capacity;
          uVar6 = (fapo->reverb).early_delay.read_idx;
          fVar38 = pfVar9[uVar6];
          (fapo->reverb).early_delay.read_idx = (uVar6 + 1) % uVar23;
          uVar6 = (fapo->reverb).early_delay.write_idx;
          pfVar9[uVar6] = fVar36;
          (fapo->reverb).early_delay.write_idx = (uVar6 + 1) % uVar23;
          pfVar9 = (fapo->reverb).apf_in[0].delay.buffer;
          uVar23 = (fapo->reverb).apf_in[0].delay.capacity;
          uVar6 = (fapo->reverb).apf_in[0].delay.read_idx;
          uVar7 = (fapo->reverb).apf_in[0].delay.write_idx;
          fVar35 = pfVar9[uVar6];
          fVar38 = (fapo->reverb).apf_in[0].feedback_gain * fVar35 + fVar38;
          pfVar9[uVar7] = fVar38;
          fVar34 = (fapo->reverb).apf_in[0].feedback_gain;
          (fapo->reverb).apf_in[0].delay.read_idx = (uVar6 + 1) % uVar23;
          (fapo->reverb).apf_in[0].delay.write_idx = (uVar7 + 1) % uVar23;
          lVar31 = 0;
          pDVar28 = (fapo->reverb).channel;
          do {
            fVar33 = DspReverb_INTERNAL_ProcessChannel(reverb,pDVar28,fVar35 - fVar38 * fVar34);
            fVar33 = fVar33 * (fapo->reverb).wet_ratio + fVar32 * fVar36;
            (&local_68.WetDryMix)[lVar31] = fVar33;
            fVar37 = fVar37 + fVar33 * fVar33;
            lVar31 = lVar31 + 1;
            pDVar28 = pDVar28 + 1;
          } while (lVar31 != 4);
          pfVar30 = pfVar30 + 2;
          *(ulong *)pfVar25 = CONCAT44(local_68.ReflectionsDelay,local_68.WetDryMix);
          pfVar25[2] = 0.0;
          pfVar25[3] = 0.0;
          *(ulong *)(pfVar25 + 4) =
               CONCAT44(local_68._12_4_,
                        CONCAT22(local_68._10_2_,CONCAT11(local_68.RearDelay,local_68.ReverbDelay)))
          ;
          pfVar25 = pfVar25 + 6;
        } while (pfVar30 < pfVar29);
        goto LAB_001178ee;
      }
    }
    else if (iVar5 == 1) {
      if (uVar23 != 0) {
        fVar37 = 0.0;
        do {
          fVar32 = *pfVar30;
          fVar38 = (fapo->reverb).dry_ratio;
          pfVar9 = (fapo->reverb).early_delay.buffer;
          uVar23 = (fapo->reverb).early_delay.capacity;
          uVar6 = (fapo->reverb).early_delay.read_idx;
          fVar35 = pfVar9[uVar6];
          (fapo->reverb).early_delay.read_idx = (uVar6 + 1) % uVar23;
          uVar6 = (fapo->reverb).early_delay.write_idx;
          pfVar9[uVar6] = fVar32;
          (fapo->reverb).early_delay.write_idx = (uVar6 + 1) % uVar23;
          pfVar9 = (fapo->reverb).apf_in[0].delay.buffer;
          uVar23 = (fapo->reverb).apf_in[0].delay.capacity;
          uVar6 = (fapo->reverb).apf_in[0].delay.read_idx;
          uVar7 = (fapo->reverb).apf_in[0].delay.write_idx;
          fVar34 = pfVar9[uVar6];
          fVar35 = (fapo->reverb).apf_in[0].feedback_gain * fVar34 + fVar35;
          pfVar9[uVar7] = fVar35;
          fVar36 = (fapo->reverb).apf_in[0].feedback_gain;
          (fapo->reverb).apf_in[0].delay.read_idx = (uVar6 + 1) % uVar23;
          (fapo->reverb).apf_in[0].delay.write_idx = (uVar7 + 1) % uVar23;
          lVar31 = 0;
          pDVar28 = (fapo->reverb).channel;
          do {
            fVar33 = DspReverb_INTERNAL_ProcessChannel(reverb,pDVar28,fVar34 - fVar35 * fVar36);
            fVar33 = fVar33 * (fapo->reverb).wet_ratio + fVar38 * fVar32;
            (&local_68.WetDryMix)[lVar31] = fVar33;
            fVar37 = fVar37 + fVar33 * fVar33;
            lVar31 = lVar31 + 1;
            pDVar28 = pDVar28 + 1;
          } while (lVar31 != 4);
          pfVar30 = pfVar30 + 1;
          *(ulong *)pfVar25 = CONCAT44(local_68.ReflectionsDelay,local_68.WetDryMix);
          pfVar25[2] = 0.0;
          pfVar25[3] = 0.0;
          *(ulong *)(pfVar25 + 4) =
               CONCAT44(local_68._12_4_,
                        CONCAT22(local_68._10_2_,CONCAT11(local_68.RearDelay,local_68.ReverbDelay)))
          ;
          pfVar25 = pfVar25 + 6;
        } while (pfVar30 < pfVar29);
        goto LAB_001178ee;
      }
    }
    else if (uVar23 != 0) {
      fVar37 = 0.0;
      do {
        fVar36 = (*pfVar30 + pfVar30[1] + pfVar30[2] + pfVar30[4] + pfVar30[5]) / 5.0;
        fVar32 = (fapo->reverb).dry_ratio;
        pfVar9 = (fapo->reverb).early_delay.buffer;
        uVar23 = (fapo->reverb).early_delay.capacity;
        uVar6 = (fapo->reverb).early_delay.read_idx;
        fVar38 = pfVar9[uVar6];
        (fapo->reverb).early_delay.read_idx = (uVar6 + 1) % uVar23;
        uVar6 = (fapo->reverb).early_delay.write_idx;
        pfVar9[uVar6] = fVar36;
        (fapo->reverb).early_delay.write_idx = (uVar6 + 1) % uVar23;
        pfVar9 = (fapo->reverb).apf_in[0].delay.buffer;
        uVar23 = (fapo->reverb).apf_in[0].delay.capacity;
        uVar6 = (fapo->reverb).apf_in[0].delay.read_idx;
        uVar7 = (fapo->reverb).apf_in[0].delay.write_idx;
        fVar35 = pfVar9[uVar6];
        fVar38 = (fapo->reverb).apf_in[0].feedback_gain * fVar35 + fVar38;
        pfVar9[uVar7] = fVar38;
        fVar34 = (fapo->reverb).apf_in[0].feedback_gain;
        (fapo->reverb).apf_in[0].delay.read_idx = (uVar6 + 1) % uVar23;
        (fapo->reverb).apf_in[0].delay.write_idx = (uVar7 + 1) % uVar23;
        lVar31 = 0;
        pDVar28 = (fapo->reverb).channel;
        do {
          fVar33 = DspReverb_INTERNAL_ProcessChannel(reverb,pDVar28,fVar35 - fVar38 * fVar34);
          fVar33 = fVar33 * (fapo->reverb).wet_ratio + fVar32 * fVar36;
          (&local_68.WetDryMix)[lVar31] = fVar33;
          fVar37 = fVar37 + fVar33 * fVar33;
          lVar31 = lVar31 + 1;
          pDVar28 = pDVar28 + 1;
        } while (lVar31 != 5);
        fVar32 = pfVar30[3];
        *pfVar25 = local_68.WetDryMix;
        pfVar25[1] = (float)local_68.ReflectionsDelay;
        pfVar25[2] = (float)CONCAT22(local_68._10_2_,
                                     CONCAT11(local_68.RearDelay,local_68.ReverbDelay));
        pfVar25[3] = fVar32;
        *(ulong *)(pfVar25 + 4) =
             CONCAT17(local_68.HighEQCutoff,
                      CONCAT16(local_68.HighEQGain,CONCAT24(local_68._16_2_,local_68._12_4_)));
        pfVar25 = pfVar25 + 6;
        pfVar30 = pfVar30 + 6;
      } while (pfVar30 < pfVar29);
      goto LAB_001178ee;
    }
  }
  fVar37 = 0.0;
LAB_001178ee:
  pOutputProcessParameters->BufferFlags = (uint)(1e-07 <= fVar37);
  FAPOBase_EndProcess(&fapo->base);
  return;
}

Assistant:

void FAudioFXReverb_Process(
	FAudioFXReverb *fapo,
	uint32_t InputProcessParameterCount,
	const FAPOProcessBufferParameters* pInputProcessParameters,
	uint32_t OutputProcessParameterCount,
	FAPOProcessBufferParameters* pOutputProcessParameters,
	int32_t IsEnabled
) {
	FAudioFXReverbParameters *params;
	uint8_t update_params = FAPOBase_ParametersChanged(&fapo->base);
	float total;
	
	/* Handle disabled filter */
	if (IsEnabled == 0)
	{
		pOutputProcessParameters->BufferFlags = pInputProcessParameters->BufferFlags;

		if (pOutputProcessParameters->BufferFlags != FAPO_BUFFER_SILENT)
		{
			FAudioFXReverb_CopyBuffer(
				fapo,
				(float*) pInputProcessParameters->pBuffer,
				(float*) pOutputProcessParameters->pBuffer,
				pInputProcessParameters->ValidFrameCount
			);
		}

		return;
	}
	
	/* XAudio2 passes a 'silent' buffer when no input buffer is available to play the effect tail */
	if (pInputProcessParameters->BufferFlags == FAPO_BUFFER_SILENT)
	{
		/* Make sure input data is usable. FIXME: Is this required? */
		FAudio_zero(
			pInputProcessParameters->pBuffer,
			pInputProcessParameters->ValidFrameCount * fapo->inBlockAlign
		);
	}

	params = (FAudioFXReverbParameters*) FAPOBase_BeginProcess(&fapo->base);

	/* Update parameters  */
	if (update_params)
	{
		if (fapo->apiVersion == 9)
		{
			DspReverb_SetParameters9(
				&fapo->reverb,
				(FAudioFXReverbParameters9*) params
			);
		}
		else
		{
			DspReverb_SetParameters(&fapo->reverb, params);
		}
	}

	/* Run reverb effect */
	#define PROCESS(pin, pout) \
		DspReverb_INTERNAL_Process_##pin##_to_##pout( \
			&fapo->reverb, \
			(float*) pInputProcessParameters->pBuffer, \
			(float*) pOutputProcessParameters->pBuffer, \
			pInputProcessParameters->ValidFrameCount * fapo->inChannels \
		)
	switch (fapo->reverb.out_channels)
	{
		case 1:
			total = PROCESS(1, 1);
			break;
		case 2:
			total = PROCESS(2, 2);
			break;
		default: /* 5.1 */
			if (fapo->reverb.in_channels == 1)
			{
				total = PROCESS(1, 5p1);
			}
			else if (fapo->reverb.in_channels == 2)
			{
				total = PROCESS(2, 5p1);
			}
			else /* 5.1 */
			{
				total = PROCESS(5p1, 5p1);
			}
			break;
	}
	#undef PROCESS

	/* Set BufferFlags to silent so PLAY_TAILS knows when to stop */
	pOutputProcessParameters->BufferFlags = (total < 0.0000001f) ?
		FAPO_BUFFER_SILENT :
		FAPO_BUFFER_VALID;

	FAPOBase_EndProcess(&fapo->base);
}